

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  pointer pfVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  void *pvVar23;
  void *pvVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  void *pvVar28;
  int iVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int remain;
  
  auVar16 = _DAT_00174030;
  auVar15 = _DAT_00174020;
  auVar14 = _DAT_00174010;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    pvVar6 = _kernel->data;
    pvVar7 = _bias->data;
    iVar5 = bottom_blob->w;
    pvVar8 = top_blob->data;
    lVar26 = top_blob->cstep * top_blob->elemsize;
    uVar17 = top_blob->h * top_blob->w;
    pfVar9 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = (ulong)uVar17 - 1;
    auVar31._8_4_ = (int)lVar18;
    auVar31._0_8_ = lVar18;
    auVar31._12_4_ = (int)((ulong)lVar18 >> 0x20);
    pvVar10 = bottom_blob->data;
    sVar11 = bottom_blob->cstep;
    sVar12 = bottom_blob->elemsize;
    lVar18 = (long)pvVar8 + 0xc;
    auVar31 = auVar31 ^ _DAT_00174030;
    lVar25 = 0;
    do {
      if (pvVar7 == (void *)0x0) {
        uVar32 = 0;
      }
      else {
        uVar32 = *(undefined4 *)((long)pvVar7 + lVar25 * 4);
      }
      fVar1 = pfVar9[lVar25];
      if (0 < (int)uVar17) {
        uVar19 = 0;
        do {
          auVar33._8_4_ = (int)uVar19;
          auVar33._0_8_ = uVar19;
          auVar33._12_4_ = (int)(uVar19 >> 0x20);
          auVar34 = (auVar33 | auVar15) ^ auVar16;
          iVar29 = auVar31._4_4_;
          if ((bool)(~(iVar29 < auVar34._4_4_ ||
                      auVar31._0_4_ < auVar34._0_4_ && auVar34._4_4_ == iVar29) & 1)) {
            *(undefined4 *)(lVar18 + -0xc + uVar19 * 4) = uVar32;
          }
          if (auVar34._12_4_ <= auVar31._12_4_ &&
              (auVar34._8_4_ <= auVar31._8_4_ || auVar34._12_4_ != auVar31._12_4_)) {
            *(undefined4 *)(lVar18 + -8 + uVar19 * 4) = uVar32;
          }
          auVar33 = (auVar33 | auVar14) ^ auVar16;
          iVar22 = auVar33._4_4_;
          if (iVar22 <= iVar29 && (iVar22 != iVar29 || auVar33._0_4_ <= auVar31._0_4_)) {
            *(undefined4 *)(lVar18 + -4 + uVar19 * 4) = uVar32;
            *(undefined4 *)(lVar18 + uVar19 * 4) = uVar32;
          }
          uVar19 = uVar19 + 4;
        } while ((uVar17 + 3 & 0xfffffffc) != uVar19);
      }
      if (0 < iVar4) {
        pvVar28 = (void *)(lVar26 * lVar25 + (long)pvVar8);
        lVar13 = lVar25 * 9;
        pvVar23 = (void *)(sVar11 * sVar12 * lVar25 + (long)pvVar10);
        pvVar24 = (void *)((long)iVar5 * 2 + (long)pvVar23);
        lVar20 = (long)iVar5 + (long)pvVar23;
        iVar29 = 0;
        do {
          if (0 < iVar3) {
            lVar27 = 2;
            lVar21 = 0;
            lVar30 = 0;
            iVar22 = iVar3 + 1;
            do {
              *(float *)((long)pvVar28 + lVar27 * 4 + -8) =
                   (float)((int)*(char *)((long)pvVar6 + lVar13 + 8) *
                           (int)*(char *)((long)pvVar24 + lVar27) +
                           (int)*(char *)((long)pvVar6 + lVar13 + 7) *
                           (int)*(char *)((long)pvVar24 + lVar27 + -1) +
                          (int)*(char *)((long)pvVar6 + lVar13 + 6) *
                          (int)*(char *)((long)pvVar24 + lVar27 + -2) +
                          (int)*(char *)((long)pvVar6 + lVar13 + 5) *
                          (int)*(char *)(lVar20 + lVar27) +
                          (int)*(char *)((long)pvVar6 + lVar13 + 4) *
                          (int)*(char *)(lVar20 + -1 + lVar27) +
                          (int)*(char *)((long)pvVar6 + lVar13 + 3) *
                          (int)*(char *)(lVar20 + -2 + lVar27) +
                          (int)*(char *)((long)pvVar6 + lVar13 + 2) *
                          (int)*(char *)((long)pvVar23 + lVar27) +
                          (int)*(char *)((long)pvVar6 + lVar13 + 1) *
                          (int)*(char *)((long)pvVar23 + lVar27 + -1) +
                          (int)*(char *)((long)pvVar6 + lVar13) *
                          (int)*(char *)((long)pvVar23 + lVar27 + -2)) * fVar1 +
                   *(float *)((long)pvVar28 + lVar27 * 4 + -8);
              iVar22 = iVar22 + -1;
              lVar30 = lVar30 + -1;
              lVar27 = lVar27 + 1;
              lVar21 = lVar21 + -4;
            } while (1 < iVar22);
            pvVar24 = (void *)((long)pvVar24 - lVar30);
            lVar20 = lVar20 - lVar30;
            pvVar23 = (void *)((long)pvVar23 - lVar30);
            pvVar28 = (void *)((long)pvVar28 - lVar21);
          }
          pvVar23 = (void *)((long)pvVar23 + 2);
          lVar20 = lVar20 + 2;
          pvVar24 = (void *)((long)pvVar24 + 2);
          iVar29 = iVar29 + 1;
        } while (iVar29 != iVar4);
      }
      lVar25 = lVar25 + 1;
      lVar18 = lVar18 + lVar26;
    } while (lVar25 != iVar2);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];    

        out.fill(bias0);    

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}